

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_ppmd8.c
# Opt level: O0

Bool Ppmd8_Alloc(CPpmd8 *p,UInt32 size)

{
  Byte *pBVar1;
  UInt32 size_local;
  CPpmd8 *p_local;
  
  if ((p->Base == (Byte *)0x0) || (p->Size != size)) {
    Ppmd8_Free(p);
    p->AlignOffset = 4 - (size & 3);
    pBVar1 = (Byte *)malloc((ulong)(p->AlignOffset + size));
    p->Base = pBVar1;
    if (pBVar1 == (Byte *)0x0) {
      return 0;
    }
    p->Size = size;
  }
  return 1;
}

Assistant:

Bool Ppmd8_Alloc(CPpmd8 *p, UInt32 size)
{
  if (p->Base == 0 || p->Size != size)
  {
    Ppmd8_Free(p);
    p->AlignOffset =
      #ifdef PPMD_32BIT
        (4 - size) & 3;
      #else
        4 - (size & 3);
      #endif
    if ((p->Base = (Byte *)malloc(p->AlignOffset + size)) == 0)
      return False;
    p->Size = size;
  }
  return True;
}